

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

string * __thiscall
pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>::toString_abi_cxx11_
          (ParamArray<pbrt::syntactic::Texture> *this)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  string *in_RDI;
  stringstream ss;
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  (**(code **)*in_RSI)(local_1b8);
  poVar1 = std::operator<<(local_188,local_1b8);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string(local_1b8);
  std::operator<<(local_188,"[ ");
  std::operator<<(local_188,"<TODO>");
  std::operator<<(local_188,"]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string ParamArray<Texture>::toString() const
    { 
      std::stringstream ss;
      ss << getType() << " ";
      ss << "[ ";
      ss << "<TODO>";
      ss << "]";
      return ss.str();
    }